

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadCodeElimination.cpp
# Opt level: O0

void __thiscall
wasm::DeadCodeElimination::visitExpression(DeadCodeElimination *this,Expression *curr)

{
  Index *this_00;
  If *curr_00;
  ExpressionList *curr_01;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Module *wasm;
  Expression **ppEVar4;
  size_type sVar5;
  reference ppEVar6;
  Block *expression;
  ulong uVar7;
  size_t sVar8;
  Loop *pLVar9;
  Try *curr_02;
  Iterator IVar10;
  bool local_2f9;
  byte local_2e1;
  Type local_248;
  BasicType local_23c [3];
  Expression *local_230;
  Expression *catchBody;
  Iterator __end6;
  Iterator __begin6;
  ExpressionList *__range6;
  bool allCatchesUnreachable;
  Try *tryy;
  Loop *loop;
  BasicType local_1e0 [4];
  If *local_1d0;
  If *iff;
  BasicType local_1bc;
  uint local_1b8;
  BasicType local_1b4;
  Index i_1;
  uint local_1ac;
  Index i;
  Index removeFromHere;
  ExpressionList *list;
  Block *block;
  BasicType local_18c;
  Expression *local_188;
  Expression *child_1;
  Index local_178;
  undefined1 local_170 [8];
  Iterator __end5;
  undefined1 local_150 [8];
  Iterator __begin5;
  ChildIterator *__range5;
  undefined1 local_f0 [7];
  bool afterUnreachable;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> remainingChildren;
  Builder builder;
  Expression *child;
  undefined1 local_a8 [8];
  Iterator __end4;
  undefined1 local_78 [8];
  Iterator __begin4;
  ChildIterator *__range4;
  bool hasUnreachableChild;
  Expression *pEStack_18;
  Expression *curr_local;
  DeadCodeElimination *this_local;
  
  pEStack_18 = curr;
  curr_local = (Expression *)this;
  bVar1 = Properties::isControlFlowStructure(curr);
  if (bVar1) {
    list = (ExpressionList *)Expression::dynCast<wasm::Block>(pEStack_18);
    if ((Block *)list == (Block *)0x0) {
      local_1d0 = Expression::dynCast<wasm::If>(pEStack_18);
      if (local_1d0 == (If *)0x0) {
        pLVar9 = Expression::dynCast<wasm::Loop>(pEStack_18);
        if (pLVar9 == (Loop *)0x0) {
          curr_02 = Expression::dynCast<wasm::Try>(pEStack_18);
          if (curr_02 == (Try *)0x0) {
            handle_unreachable("unimplemented DCE control flow structure",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DeadCodeElimination.cpp"
                               ,0xb3);
          }
          bVar1 = true;
          join_0x00000010_0x00000000_ =
               ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                         (&(curr_02->catchBodies).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
          _catchBody = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                                 (&(curr_02->catchBodies).
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 );
          while (bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                         Iterator::operator!=((Iterator *)&__end6.index,(Iterator *)&catchBody),
                bVar2) {
            ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator
                      ::operator*((Iterator *)&__end6.index);
            local_230 = *ppEVar4;
            local_23c[2] = 1;
            bVar2 = wasm::Type::operator==(&local_230->type,local_23c + 2);
            bVar1 = (bVar1 & bVar2) != 0;
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator++((Iterator *)&__end6.index);
          }
          local_23c[1] = 1;
          bVar3 = wasm::Type::operator!=
                            (&(curr_02->super_SpecificExpression<(wasm::Expression::Id)49>).
                              super_Expression.type,local_23c + 1);
          bVar2 = false;
          if (bVar3) {
            local_23c[0] = unreachable;
            bVar3 = wasm::Type::operator==(&curr_02->body->type,local_23c);
            bVar2 = bVar1;
            if (!bVar3) {
              bVar2 = false;
            }
          }
          if (bVar2 != false) {
            wasm::Type::Type(&local_248,unreachable);
            TypeUpdater::changeType(&this->typeUpdater,(Expression *)curr_02,local_248);
          }
        }
        else {
          bVar1 = Expression::is<wasm::Unreachable>(pLVar9->body);
          if (bVar1) {
            replaceCurrent(this,pLVar9->body);
          }
        }
      }
      else {
        local_1e0[3] = 1;
        bVar1 = wasm::Type::operator==(&local_1d0->condition->type,local_1e0 + 3);
        if (bVar1) {
          TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,local_1d0->ifTrue);
          if (local_1d0->ifFalse != (Expression *)0x0) {
            TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,local_1d0->ifFalse);
          }
          replaceCurrent(this,local_1d0->condition);
        }
        else {
          local_1e0[2] = 1;
          bVar1 = wasm::Type::operator!=
                            (&(local_1d0->super_SpecificExpression<(wasm::Expression::Id)2>).
                              super_Expression.type,local_1e0 + 2);
          local_2f9 = false;
          if ((bVar1) && (local_2f9 = false, local_1d0->ifFalse != (Expression *)0x0)) {
            local_1e0[1] = 1;
            bVar1 = wasm::Type::operator==(&local_1d0->ifTrue->type,local_1e0 + 1);
            local_2f9 = false;
            if (bVar1) {
              local_1e0[0] = unreachable;
              local_2f9 = wasm::Type::operator==(&local_1d0->ifFalse->type,local_1e0);
            }
          }
          curr_00 = local_1d0;
          if (local_2f9 != false) {
            wasm::Type::Type((Type *)&loop,unreachable);
            TypeUpdater::changeType(&this->typeUpdater,(Expression *)curr_00,(Type)loop);
          }
        }
      }
    }
    else {
      _i = &(((Block *)list)->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
      local_1ac = 0;
      for (i_1 = 0; uVar7 = (ulong)i_1,
          sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(_i),
          uVar7 < sVar8; i_1 = i_1 + 1) {
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (_i,(ulong)i_1);
        local_1b4 = unreachable;
        bVar1 = wasm::Type::operator==(&(*ppEVar4)->type,&local_1b4);
        if (bVar1) {
          local_1ac = i_1 + 1;
          break;
        }
      }
      if (local_1ac != 0) {
        for (local_1b8 = local_1ac; uVar7 = (ulong)local_1b8,
            sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(_i),
            uVar7 < sVar8; local_1b8 = local_1b8 + 1) {
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (_i,(ulong)local_1b8);
          TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,*ppEVar4);
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                  (_i,(ulong)local_1ac);
        sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(_i);
        if (sVar8 == 1) {
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (_i,0);
          bVar1 = Expression::is<wasm::Unreachable>(*ppEVar4);
          if (bVar1) {
            ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](_i,0);
            replaceCurrent(this,*ppEVar4);
            return;
          }
        }
      }
      bVar1 = wasm::Type::isConcrete
                        ((Type *)&(list->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  ).usedElements);
      local_2e1 = 0;
      if (bVar1) {
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back(_i);
        local_1bc = unreachable;
        bVar1 = wasm::Type::operator==(&(*ppEVar4)->type,&local_1bc);
        local_2e1 = 0;
        if (bVar1) {
          bVar1 = TypeUpdater::hasBreaks(&this->typeUpdater,(Block *)list);
          local_2e1 = bVar1 ^ 0xff;
        }
      }
      curr_01 = list;
      if ((local_2e1 & 1) != 0) {
        wasm::Type::Type((Type *)&iff,unreachable);
        TypeUpdater::changeType(&this->typeUpdater,(Expression *)curr_01,(Type)iff);
      }
    }
  }
  else {
    __range4._4_4_ = 1;
    bVar1 = wasm::Type::operator==(&pEStack_18->type,(BasicType *)((long)&__range4 + 4));
    if (bVar1) {
      __range4._3_1_ = 0;
      this_00 = &__begin4.index;
      ChildIterator::ChildIterator((ChildIterator *)this_00,pEStack_18);
      IVar10 = AbstractChildIterator<wasm::ChildIterator>::begin
                         ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
      __end4._8_8_ = IVar10.parent;
      __begin4.parent._0_4_ = IVar10.index;
      local_78 = (undefined1  [8])__end4._8_8_;
      IVar10 = AbstractChildIterator<wasm::ChildIterator>::end
                         ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
      local_a8 = (undefined1  [8])IVar10.parent;
      __end4.parent._0_4_ = IVar10.index;
      while (bVar1 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                               ((Iterator *)local_78,(Iterator *)local_a8), bVar1) {
        ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                            ((Iterator *)local_78);
        builder.wasm._4_4_ = 1;
        bVar1 = wasm::Type::operator==(&(*ppEVar4)->type,(BasicType *)((long)&builder.wasm + 4));
        if (bVar1) {
          __range4._3_1_ = 1;
          break;
        }
        AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_78);
      }
      ChildIterator::~ChildIterator((ChildIterator *)&__begin4.index);
      if ((__range4._3_1_ & 1) != 0) {
        wasm = Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>_>
                            ).
                            super_PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                            .
                            super_Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                          );
        Builder::Builder((Builder *)
                         &remainingChildren.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,wasm);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_f0);
        bVar1 = false;
        ChildIterator::ChildIterator((ChildIterator *)&__begin5.index,pEStack_18);
        IVar10 = AbstractChildIterator<wasm::ChildIterator>::begin
                           ((AbstractChildIterator<wasm::ChildIterator> *)&__begin5.index);
        __end5._8_8_ = IVar10.parent;
        __begin5.parent._0_4_ = IVar10.index;
        local_150 = (undefined1  [8])__end5._8_8_;
        IVar10 = AbstractChildIterator<wasm::ChildIterator>::end
                           ((AbstractChildIterator<wasm::ChildIterator> *)&__begin5.index);
        child_1 = (Expression *)IVar10.parent;
        local_178 = IVar10.index;
        local_170 = (undefined1  [8])child_1;
        __end5.parent._0_4_ = local_178;
        while (bVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                                 ((Iterator *)local_150,(Iterator *)local_170), bVar2) {
          ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                              ((Iterator *)local_150);
          local_188 = *ppEVar4;
          if (bVar1) {
            TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,local_188);
          }
          else {
            local_18c = unreachable;
            bVar2 = wasm::Type::operator==(&local_188->type,&local_18c);
            if (bVar2) {
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_f0
                         ,&local_188);
              bVar1 = true;
            }
            else {
              block = (Block *)Builder::makeDrop((Builder *)
                                                 &remainingChildren.
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 ,local_188);
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_f0
                         ,(value_type *)&block);
            }
          }
          AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_150);
        }
        ChildIterator::~ChildIterator((ChildIterator *)&__begin5.index);
        sVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           local_f0);
        if (sVar5 == 1) {
          ppEVar6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               local_f0,0);
          replaceCurrent(this,*ppEVar6);
        }
        else {
          expression = Builder::
                       makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                 ((Builder *)
                                  &remainingChildren.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *
                                  )local_f0);
          replaceCurrent(this,(Expression *)expression);
        }
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_f0);
      }
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    if (!Properties::isControlFlowStructure(curr)) {
      // Control flow structures require special handling, but others are
      // simple.
      if (curr->type == Type::unreachable) {
        // This may be dead code. Check if there is an unreachable child.
        bool hasUnreachableChild = false;
        for (auto* child : ChildIterator(curr)) {
          if (child->type == Type::unreachable) {
            hasUnreachableChild = true;
            break;
          }
        }
        if (hasUnreachableChild) {
          // This is indeed unreachable code, made unreachable by that child.
          Builder builder(*getModule());
          std::vector<Expression*> remainingChildren;
          bool afterUnreachable = false;
          for (auto* child : ChildIterator(curr)) {
            if (afterUnreachable) {
              typeUpdater.noteRecursiveRemoval(child);
              continue;
            }
            if (child->type == Type::unreachable) {
              remainingChildren.push_back(child);
              afterUnreachable = true;
            } else {
              remainingChildren.push_back(builder.makeDrop(child));
            }
          }
          if (remainingChildren.size() == 1) {
            replaceCurrent(remainingChildren[0]);
          } else {
            replaceCurrent(builder.makeBlock(remainingChildren));
          }
        }
      }
      return;
    }
    // This is a control flow structure.
    if (auto* block = curr->dynCast<Block>()) {
      auto& list = block->list;
      // The index from which to remove, which is one after the first
      // unreachable instruction. Note that 0 is not a valid value, so we can
      // use it as such.
      Index removeFromHere = 0;
      for (Index i = 0; i < list.size(); i++) {
        if (list[i]->type == Type::unreachable) {
          removeFromHere = i + 1;
          break;
        }
      }
      if (removeFromHere != 0) {
        for (Index i = removeFromHere; i < list.size(); i++) {
          typeUpdater.noteRecursiveRemoval(list[i]);
        }
        list.resize(removeFromHere);
        if (list.size() == 1 && list[0]->is<Unreachable>()) {
          replaceCurrent(list[0]);
          return;
        }
      }
      // Finally, if there is no need for a concrete type (which is when there
      // is one marked, but nothing breaks to it, and also the block does not
      // have a concrete value flowing out) then remove it, which may allow
      // more reduction.
      if (block->type.isConcrete() && list.back()->type == Type::unreachable &&
          !typeUpdater.hasBreaks(block)) {
        typeUpdater.changeType(block, Type::unreachable);
      }
    } else if (auto* iff = curr->dynCast<If>()) {
      if (iff->condition->type == Type::unreachable) {
        typeUpdater.noteRecursiveRemoval(iff->ifTrue);
        if (iff->ifFalse) {
          typeUpdater.noteRecursiveRemoval(iff->ifFalse);
        }
        replaceCurrent(iff->condition);
        return;
      }
      // If both arms are unreachable, there is no need for a concrete type,
      // which may allow more reduction.
      if (iff->type != Type::unreachable && iff->ifFalse &&
          iff->ifTrue->type == Type::unreachable &&
          iff->ifFalse->type == Type::unreachable) {
        typeUpdater.changeType(iff, Type::unreachable);
      }
    } else if (auto* loop = curr->dynCast<Loop>()) {
      // The loop body may have unreachable type if it branches back to the
      // loop top, for example. The only case we look for here is where we've
      // already removed the entire body as dead code.
      if (loop->body->is<Unreachable>()) {
        replaceCurrent(loop->body);
      }
    } else if (auto* tryy = curr->dynCast<Try>()) {
      // If both try body and catch body are unreachable, there is no need for a
      // concrete type, which may allow more reduction.
      bool allCatchesUnreachable = true;
      for (auto* catchBody : tryy->catchBodies) {
        allCatchesUnreachable &= catchBody->type == Type::unreachable;
      }
      if (tryy->type != Type::unreachable &&
          tryy->body->type == Type::unreachable && allCatchesUnreachable) {
        typeUpdater.changeType(tryy, Type::unreachable);
      }
    } else {
      WASM_UNREACHABLE("unimplemented DCE control flow structure");
    }
  }